

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_c_coef_controller *pjVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  jpeg_c_coef_controller *pjVar5;
  jpeg_component_info *pjVar6;
  uint uVar7;
  boolean bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  JDIMENSION JVar17;
  long lVar18;
  int iVar19;
  
  pjVar5 = cinfo->coef;
  JVar2 = cinfo->total_iMCU_rows;
  uVar10 = cinfo->MCUs_per_row - 1;
  iVar9 = *(int *)&pjVar5[1].compress_data;
  pjVar1 = pjVar5 + 2;
  do {
    if (*(int *)((long)&pjVar5[1].compress_data + 4) <= iVar9) {
      *(int *)&pjVar5[1].start_pass = *(int *)&pjVar5[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (uVar14 = *(uint *)((long)&pjVar5[1].start_pass + 4); uVar14 <= uVar10; uVar14 = uVar14 + 1)
    {
      iVar19 = 0;
      for (lVar12 = 0; lVar12 < cinfo->comps_in_scan; lVar12 = lVar12 + 1) {
        pjVar6 = cinfo->cur_comp_info[lVar12];
        JVar3 = (&pjVar6->MCU_width)[(ulong)(uVar10 <= uVar14) * 4];
        iVar4 = pjVar6->MCU_sample_width;
        JVar17 = iVar9 * 8;
        for (iVar13 = 0; iVar13 < pjVar6->MCU_height; iVar13 = iVar13 + 1) {
          lVar15 = (long)iVar19;
          if ((*(uint *)&pjVar5[1].start_pass < JVar2 - 1) ||
             (iVar9 + iVar13 < pjVar6->last_row_height)) {
            (*cinfo->fdct->forward_DCT)
                      (cinfo,pjVar6,input_buf[pjVar6->component_index],
                       (JBLOCKROW)(&pjVar1->start_pass)[lVar15],JVar17,iVar4 * uVar14,JVar3);
            uVar7 = pjVar6->MCU_width;
            if ((int)JVar3 < (int)uVar7) {
              jzero_far((JBLOCKROW)(&pjVar1->start_pass)[(int)(iVar19 + JVar3)],
                        (long)(int)(uVar7 - JVar3) << 7);
              uVar7 = pjVar6->MCU_width;
              for (lVar18 = (long)(int)JVar3; lVar18 < (int)uVar7; lVar18 = lVar18 + 1) {
                (*(JBLOCKROW)(&pjVar1->start_pass)[lVar15 + lVar18])[0] =
                     **(JCOEF **)((long)pjVar1 + lVar18 * 8 + lVar15 * 8 + -8);
              }
            }
          }
          else {
            jzero_far((JBLOCKROW)(&pjVar1->start_pass)[lVar15],(long)pjVar6->MCU_width << 7);
            uVar7 = pjVar6->MCU_width;
            uVar11 = 0;
            if (0 < (int)uVar7) {
              uVar11 = (ulong)uVar7;
            }
            for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
              (*(JBLOCKROW)(&pjVar1->start_pass)[lVar15 + uVar16])[0] =
                   (*(JBLOCKROW)(&pjVar1->start_pass)[iVar19 + -1])[0];
            }
          }
          iVar19 = iVar19 + uVar7;
          JVar17 = JVar17 + 8;
        }
      }
      bVar8 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)pjVar1);
      if (bVar8 == 0) {
        *(int *)&pjVar5[1].compress_data = iVar9;
        *(uint *)((long)&pjVar5[1].start_pass + 4) = uVar14;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar5[1].start_pass + 4) = 0;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_data(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width :
                                                  compptr->last_col_width;
        xpos = MCU_col_num * compptr->MCU_sample_width;
        ypos = yoffset * DCTSIZE; /* ypos == (yoffset+yindex) * DCTSIZE */
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          if (coef->iMCU_row_num < last_iMCU_row ||
              yoffset + yindex < compptr->last_row_height) {
            (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                         input_buf[compptr->component_index],
                                         coef->MCU_buffer[blkn],
                                         ypos, xpos, (JDIMENSION)blockcnt);
            if (blockcnt < compptr->MCU_width) {
              /* Create some dummy blocks at the right edge of the image. */
              jzero_far((void *)coef->MCU_buffer[blkn + blockcnt],
                        (compptr->MCU_width - blockcnt) * sizeof(JBLOCK));
              for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
                coef->MCU_buffer[blkn + bi][0][0] =
                  coef->MCU_buffer[blkn + bi - 1][0][0];
              }
            }
          } else {
            /* Create a row of dummy blocks at the bottom of the image. */
            jzero_far((void *)coef->MCU_buffer[blkn],
                      compptr->MCU_width * sizeof(JBLOCK));
            for (bi = 0; bi < compptr->MCU_width; bi++) {
              coef->MCU_buffer[blkn + bi][0][0] =
                coef->MCU_buffer[blkn - 1][0][0];
            }
          }
          blkn += compptr->MCU_width;
          ypos += DCTSIZE;
        }
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}